

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::multiPartInitialize(DeepScanLineInputFile *this,InputPartData *part)

{
  byte bVar1;
  long in_RSI;
  long in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000088;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000090;
  Header *in_stack_00000648;
  DeepScanLineInputFile *in_stack_00000650;
  
  *(undefined8 *)(*(long *)(in_RDI + 8) + 0x1f8) = *(undefined8 *)(in_RSI + 0x48);
  bVar1 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28) + 0x10))();
  *(byte *)(*(long *)(in_RDI + 8) + 0x180) = bVar1 & 1;
  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x60) = *(undefined4 *)(in_RSI + 0x40);
  initialize(in_stack_00000650,in_stack_00000648);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_00000090,in_stack_00000088);
  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x16c) = *(undefined4 *)(in_RSI + 0x3c);
  return;
}

Assistant:

void
DeepScanLineInputFile::multiPartInitialize (InputPartData* part)
{

    _data->_streamData  = part->mutex;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped ();
    _data->version      = part->version;

    initialize (part->header);

    _data->lineOffsets = part->chunkOffsets;

    _data->partNumber = part->partNumber;
}